

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O3

string * fs_compiler_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  in_RDI->_M_string_length = 0;
  (in_RDI->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_replace((ulong)in_RDI,0,(char *)0x0,0x123ee5);
  return in_RDI;
}

Assistant:

std::string fs_compiler()
{

  std::string v;
#if defined(__INTEL_LLVM_COMPILER)

#ifdef __cpp_lib_format // C++20
  v = std::format("{} {}", __VERSION__, __INTEL_LLVM_COMPILER);
#else
  v = std::string(__VERSION__) + " " + std::to_string(__INTEL_LLVM_COMPILER);
#endif

#elif defined(__NVCOMPILER_LLVM__)

// not __VERSION__ because it emits "EDG g++ mode" instead of "NVIDIA"

#ifdef __cpp_lib_format
  v = std::format("NVIDIA {}.{}.{}", __NVCOMPILER_MAJOR__, __NVCOMPILER_MINOR__, __NVCOMPILER_PATCHLEVEL__);
#else
  v = "NVIDIA " + std::to_string(__NVCOMPILER_MAJOR__) + "." + std::to_string(__NVCOMPILER_MINOR__) + "." + std::to_string(__NVCOMPILER_PATCHLEVEL__);
#endif

#elif defined(__clang__)

# ifdef __VERSION__
  v = __VERSION__;
# elif defined(__cpp_lib_format)
  v = std::format("Clang {}.{}.{}", __clang_major__, __clang_minor__, __clang_patchlevel__);
# else
  v = "Clang " + std::to_string(__clang_major__) + "." + std::to_string(__clang_minor__) + "." + std::to_string(__clang_patchlevel__);
# endif

#elif defined(__GNUC__)

# ifdef __cpp_lib_format
v = std::format("GNU GCC {}.{}.{}", __GNUC__, __GNUC_MINOR__, __GNUC_PATCHLEVEL__);
# else
v = "GNU GCC " + std::to_string(__GNUC__) + "." + std::to_string(__GNUC_MINOR__) + "." + std::to_string(__GNUC_PATCHLEVEL__);
# endif

#elif defined(_MSC_FULL_VER)
  v = "MSVC " + std::to_string(_MSC_FULL_VER);
#endif

  return v;
}